

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void do_stop_waiting_for_dialog_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value local_50;
  Am_Object local_40;
  undefined1 local_38 [8];
  Am_Value v;
  Am_Object local_18;
  Am_Object widget;
  Am_Object *cmd_local;
  
  widget.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)cmd);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_38);
    in_value = Am_Object::Peek(&local_18,0x169,0);
    Am_Value::operator=((Am_Value *)local_38,in_value);
    Am_Object::Am_Object(&local_40,&local_18);
    Am_Value::Am_Value(&local_50,(Am_Value *)local_38);
    Am_Finish_Pop_Up_Waiting(&local_40,&local_50);
    Am_Value::~Am_Value(&local_50);
    Am_Object::~Am_Object(&local_40);
    Am_Value::~Am_Value((Am_Value *)local_38);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_stop_waiting_for_dialog,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner();
  if (widget.Valid()) {
    // we want to stop the text input widget if it exists
    Am_Value v;
    v = widget.Peek(Am_VALUE);
    Am_Finish_Pop_Up_Waiting(widget, v);
  }
  // else do nothing, something's not valid.
}